

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  string local_198;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_178;
  Environment env;
  Resources res;
  
  Environment::Environment(&env,(Context *)this,1);
  Framebuffer::Resources::Resources(&res,&env,extraout_RDX);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_178,&env,&res,param_4);
  local_198.field_2._M_allocated_capacity = (size_type)local_178.m_data.deleter.m_device;
  local_198.field_2._8_8_ = local_178.m_data.deleter.m_allocator;
  local_198._M_dataplus._M_p = (pointer)local_178.m_data.object.m_internal;
  local_198._M_string_length = (size_type)local_178.m_data.deleter.m_deviceIface;
  local_178.m_data.object.m_internal = 0;
  local_178.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_178.m_data.deleter.m_device = (VkDevice)0x0;
  local_178.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_178);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_198);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Ok",(allocator<char> *)&local_178);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  Framebuffer::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}